

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O1

void __thiscall
Centaurus::LDFARoutineEM64T<wchar_t>::LDFARoutineEM64T
          (LDFARoutineEM64T<wchar_t> *this,LookaheadDFA<wchar_t> *ldfa,Logger *logger)

{
  Assembler *this_00;
  uint uVar1;
  anon_union_16_7_ed616b9d_for_Operand__0 *o1;
  sockaddr *__addr;
  sockaddr *extraout_RDX;
  long lVar2;
  uint uVar3;
  CodeHolder *pCVar4;
  Label LVar5;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> exitlabels;
  Label finishlabel;
  Label rejectlabel;
  X86Assembler as;
  anon_union_16_7_ed616b9d_for_Operand__0 local_148;
  anon_union_8_2_78723da6_for_MemData_2 local_138;
  anon_union_16_7_ed616b9d_for_Operand__0 local_128;
  CodeHolder *local_118;
  JitRuntime *local_110;
  undefined1 local_108 [216];
  
  o1 = &local_148;
  this->_vptr_LDFARoutineEM64T = (_func_int **)&PTR__LDFARoutineEM64T_0019f7d0;
  asmjit::JitRuntime::JitRuntime(&this->m_runtime);
  pCVar4 = &this->m_code;
  asmjit::CodeHolder::CodeHolder(pCVar4);
  asmjit::CodeHolder::init
            (pCVar4,(EVP_PKEY_CTX *)&(this->m_runtime).super_HostRuntime.super_Runtime._codeInfo);
  if (logger != (Logger *)0x0) {
    asmjit::CodeHolder::setLogger(pCVar4,logger);
  }
  asmjit::X86Assembler::X86Assembler((X86Assembler *)(local_108 + 0x20),pCVar4);
  emit_parser_prolog((X86Assembler *)(local_108 + 0x20));
  local_148._packed[0] = (UInt64)&DAT_00000032;
  local_148._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0x400000020;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)(local_108 + 0x20),0x189,(Operand_ *)(asmjit::x86OpData + 0x4e0),
             (Operand_ *)&local_148._any);
  local_118 = pCVar4;
  local_110 = &this->m_runtime;
  asmjit::Assembler::newLabel((Assembler *)local_108);
  local_148._packed[0] = (UInt64)0x0;
  local_148._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0x0;
  local_138.offset64 = 0;
  uVar1 = LookaheadDFA<wchar_t>::get_color_num(ldfa);
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
    do {
      asmjit::Assembler::newLabel((Assembler *)&local_128._any);
      if (local_148._mem.field_2.offset64 ==
          (anon_union_8_2_78723da6_for_MemData_2)local_138.offset64) {
        std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::_M_realloc_insert<asmjit::Label>
                  ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)&local_148._any,
                   (iterator)local_148._mem.field_2,(Label *)&local_128._any);
      }
      else {
        *(UInt64 *)local_148._mem.field_2 = local_128._packed[0];
        *(anon_union_8_2_78723da6_for_MemData_2 *)((long)local_148._mem.field_2 + 8) =
             local_128._mem.field_2;
        local_148._mem.field_2 =
             (anon_union_8_2_78723da6_for_MemData_2)((long)local_148._mem.field_2 + 0x10);
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  emit((X86Assembler *)(local_108 + 0x20),(Label *)local_108,ldfa,
       (vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)&local_148._any);
  asmjit::CodeEmitter::emit((CodeEmitter *)(local_108 + 0x20),0x11e,(Operand_ *)local_108);
  LVar5 = asmjit::Assembler::newLabel((Assembler *)&local_128._any);
  __addr = LVar5.super_Operand.super_Operand_.field_0._8_8_;
  pCVar4 = (CodeHolder *)0x1;
  this_00 = (Assembler *)(local_108 + 0x20);
  for (lVar2 = 0; (ulong)(~((int)uVar1 >> 0x1f) & uVar1) << 4 != lVar2; lVar2 = lVar2 + 0x10) {
    asmjit::Assembler::bind(this_00,local_148._0_4_ + (int)lVar2,__addr,(socklen_t)o1);
    local_108._16_8_ = 3;
    o1 = (anon_union_16_7_ed616b9d_for_Operand__0 *)(local_108 + 0x10);
    local_108._24_8_ = pCVar4;
    asmjit::CodeEmitter::emit
              ((CodeEmitter *)this_00,0x189,(Operand_ *)(asmjit::x86OpData + 0x4e0),
               (Operand_ *)&o1->_any);
    pCVar4 = (CodeHolder *)((long)&(pCVar4->_codeInfo)._archInfo.field_0 + 1);
    asmjit::CodeEmitter::emit((CodeEmitter *)this_00,0x11e,(Operand_ *)&local_128._any);
    __addr = extraout_RDX;
  }
  asmjit::Assembler::bind((Assembler *)(local_108 + 0x20),(int)&local_128,__addr,(socklen_t)o1);
  emit_parser_epilog((X86Assembler *)(local_108 + 0x20),(Label *)local_108);
  asmjit::CodeEmitter::finalize((CodeEmitter *)(local_108 + 0x20));
  if (local_148._packed[0].i64 != 0) {
    operator_delete((void *)local_148._packed[0]);
  }
  asmjit::X86Assembler::~X86Assembler((X86Assembler *)(local_108 + 0x20));
  return;
}

Assistant:

LDFARoutineEM64T<TCHAR>::LDFARoutineEM64T(const LookaheadDFA<TCHAR>& ldfa, asmjit::Logger *logger)
{
    m_code.init(m_runtime.getCodeInfo());
    if (logger != NULL)
        m_code.setLogger(logger);

    asmjit::X86Assembler as(&m_code);

    emit_parser_prolog(as);

    as.mov(INPUT_REG, asmjit::X86Mem(asmjit::x86::rsp, ARG1_STACK_OFFSET));

    asmjit::Label rejectlabel = as.newLabel();

    std::vector<asmjit::Label> exitlabels;

    int decision_num = ldfa.get_color_num();
    for (int i = 0; i < decision_num; i++)
    {
        exitlabels.push_back(as.newLabel());
    }

    emit(as, rejectlabel, ldfa, exitlabels);
    as.jmp(rejectlabel);

    asmjit::Label finishlabel = as.newLabel();
    for (int i = 0; i < decision_num; i++)
    {
        as.bind(exitlabels[i]);
        as.mov(INPUT_REG, asmjit::Imm(i + 1));
        as.jmp(finishlabel);
    }

    as.bind(finishlabel);
    emit_parser_epilog(as, rejectlabel);
   
    as.finalize();
}